

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsact.c
# Opt level: O0

void acc_net_add(Item *qname,Item *qpar1,Item *qexpr,Item *qpar2,char *xarg1,char *xarg2)

{
  Symbol *in_RCX;
  long in_RSI;
  undefined8 in_R8;
  Item *in_R9;
  Item *q;
  char *in_stack_ffffffffffffffc8;
  Symbol *sym;
  
  if (artificial_cell == 0) {
    sprintf(buf,"\n#if NET_RECEIVE_BUFFERING\n    _net_send_buffering(_ml->_net_send_buffer, %s",
            in_R8);
    insertstr(in_R9,in_stack_ffffffffffffffc8);
    for (sym = *(Symbol **)(in_RSI + 0x10); sym != in_RCX; sym = *(Symbol **)&sym->nrntype) {
      if (sym->type == 1) {
        insertsym(in_R9,sym);
      }
      else if (sym->type == 0x143) {
        insertstr(in_R9,(char *)sym);
      }
      else {
        diag((char *)in_R9,(char *)sym);
      }
    }
    sprintf(buf,"%s);\n#else\n",in_R9);
    insertstr(in_R9,(char *)sym);
    insertstr(in_R9,(char *)sym);
  }
  return;
}

Assistant:

void acc_net_add(Item* qname, Item* qpar1, Item* qexpr, Item* qpar2, const char* xarg1, const char* xarg2) {
  Item *q;
  if (artificial_cell) { return; }
  sprintf(buf, "\
\n#if NET_RECEIVE_BUFFERING\
\n    _net_send_buffering(_ml->_net_send_buffer, %s\
", xarg1);
  Insertstr(qname, buf);
  for (q = qpar1->next; q != qpar2; q = q->next) {
    if (q->itemtype == SYMBOL) {
	    insertsym(qname, SYM(q));
    }else if (q->itemtype == STRING) {
      insertstr(qname, STR(q));
    }else{
      diag("acc_net_add failed because item neither STRING nor SYMBOL");
    }
  }
  sprintf(buf, "%s);\n#else\n", xarg2);
  Insertstr(qname, buf);
  Insertstr(qpar2->next, "\n#endif\n");
}